

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::Configuration::Configuration(Configuration *this,Configuration *c)

{
  ConfigurationType CVar1;
  
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__Configuration_0012b220;
  CVar1 = c->m_configurationType;
  this->m_level = c->m_level;
  this->m_configurationType = CVar1;
  std::__cxx11::string::string((string *)&this->m_value,(string *)&c->m_value);
  return;
}

Assistant:

Configuration::Configuration(const Configuration& c) :
  m_level(c.m_level),
  m_configurationType(c.m_configurationType),
  m_value(c.m_value) {
}